

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Generators<arg_res_tuple<long_double,_1UL>_> * __thiscall
Catch::Generators::
makeGenerators<arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>>
          (Generators<arg_res_tuple<long_double,_1UL>_> *__return_storage_ptr__,Generators *this,
          arg_res_tuple<long_double,_1UL> *val,arg_res_tuple<long_double,_1UL> *moreGenerators,
          arg_res_tuple<long_double,_1UL> *moreGenerators_1,
          arg_res_tuple<long_double,_1UL> *moreGenerators_2,
          arg_res_tuple<long_double,_1UL> *moreGenerators_3,
          arg_res_tuple<long_double,_1UL> *moreGenerators_4,
          arg_res_tuple<long_double,_1UL> *moreGenerators_5,
          arg_res_tuple<long_double,_1UL> *moreGenerators_6,
          arg_res_tuple<long_double,_1UL> *moreGenerators_7,
          arg_res_tuple<long_double,_1UL> *moreGenerators_8,
          arg_res_tuple<long_double,_1UL> *moreGenerators_9,
          arg_res_tuple<long_double,_1UL> *moreGenerators_10,
          arg_res_tuple<long_double,_1UL> *moreGenerators_11,
          arg_res_tuple<long_double,_1UL> *moreGenerators_12,
          arg_res_tuple<long_double,_1UL> *moreGenerators_13,
          arg_res_tuple<long_double,_1UL> *moreGenerators_14,
          arg_res_tuple<long_double,_1UL> *moreGenerators_15)

{
  long lVar1;
  long lVar2;
  long lVar3;
  GeneratorWrapper<arg_res_tuple<long_double,_1UL>_> local_38;
  
  local_38.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>.
  _M_head_impl = (unique_ptr<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  )operator_new(0x30);
  *(undefined ***)
   local_38.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>.
   _M_head_impl = &PTR__GeneratorUntypedBase_0031aa08;
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  lVar3 = *(long *)(this + 0x18);
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                  ._M_head_impl + 0x10) = *(long *)this;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                  ._M_head_impl + 0x18) = lVar1;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                  ._M_head_impl + 0x20) = lVar2;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                  ._M_head_impl + 0x28) = lVar3;
  Generators<arg_res_tuple<long_double,1ul>>::
  Generators<Catch::Generators::GeneratorWrapper<arg_res_tuple<long_double,1ul>>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>>
            ((Generators<arg_res_tuple<long_double,1ul>> *)__return_storage_ptr__,&local_38,val,
             moreGenerators,moreGenerators_1,moreGenerators_2,moreGenerators_3,moreGenerators_4,
             moreGenerators_5,moreGenerators_6,moreGenerators_7,moreGenerators_8,moreGenerators_9,
             moreGenerators_10,moreGenerators_11,moreGenerators_12,moreGenerators_13,
             moreGenerators_14);
  if (local_38.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<long_double,_1UL>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }